

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ApiColumnLocale(Fts5Context *pCtx,int iCol,char **pzLocale,int *pnLocale)

{
  Fts5Config *pConfig;
  int iVar1;
  long in_FS_OFFSET;
  int local_3c;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pConfig = *(Fts5Config **)(*(long *)pCtx + 0x18);
  *pzLocale = (char *)0x0;
  *pnLocale = 0;
  iVar1 = 0x19;
  if ((((-1 < iCol) && (iCol < pConfig->nCol)) &&
      (iVar1 = 0, pConfig->abUnindexed[(uint)iCol] == '\0')) &&
     (((*(uint *)(*(long *)(*(long *)pCtx + 0x18) + 0x48) & 0xfffffffd) != 1 &&
      (pConfig->bLocale != 0)))) {
    iVar1 = fts5SeekCursor((Fts5Cursor *)pCtx,0);
    if (iVar1 == 0) {
      iVar1 = fts5TextFromStmt(pConfig,*(sqlite3_stmt **)(pCtx + 0x38),iCol,&local_38,&local_3c);
      if (iVar1 == 0) {
        *pzLocale = (pConfig->t).pLocale;
        *pnLocale = (pConfig->t).nLocale;
      }
      (pConfig->t).pLocale = (char *)0x0;
      (pConfig->t).nLocale = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5ApiColumnLocale(
  Fts5Context *pCtx,
  int iCol,
  const char **pzLocale,
  int *pnLocale
){
  int rc = SQLITE_OK;
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5Config *pConfig = ((Fts5Table*)(pCsr->base.pVtab))->pConfig;

  *pzLocale = 0;
  *pnLocale = 0;

  assert( pCsr->ePlan!=FTS5_PLAN_SPECIAL );
  if( iCol<0 || iCol>=pConfig->nCol ){
    rc = SQLITE_RANGE;
  }else if(
      pConfig->abUnindexed[iCol]==0
   && 0==fts5IsContentless((Fts5FullTable*)pCsr->base.pVtab, 1)
   && pConfig->bLocale
  ){
    rc = fts5SeekCursor(pCsr, 0);
    if( rc==SQLITE_OK ){
      const char *zDummy = 0;
      int nDummy = 0;
      rc = fts5TextFromStmt(pConfig, pCsr->pStmt, iCol, &zDummy, &nDummy);
      if( rc==SQLITE_OK ){
        *pzLocale = pConfig->t.pLocale;
        *pnLocale = pConfig->t.nLocale;
      }
      sqlite3Fts5ClearLocale(pConfig);
    }
  }

  return rc;
}